

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O0

void __thiscall QIBusEngineDesc::serializeTo(QIBusEngineDesc *this,QDBusArgument *argument)

{
  QDBusArgument *in_RSI;
  long in_RDI;
  QDBusArgument *unaff_retaddr;
  
  QDBusArgument::beginStructure();
  QIBusSerializable::serializeTo((QIBusSerializable *)argument,unaff_retaddr);
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x20));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x38));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x50));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x68));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x80));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x98));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0xb0));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 200));
  QDBusArgument::operator<<(in_RSI,*(uint *)(in_RDI + 0xe0));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0xe8));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x100));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x118));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x130));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x148));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x160));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 0x178));
  QDBusArgument::operator<<(in_RSI,(QString *)(in_RDI + 400));
  QDBusArgument::endStructure();
  return;
}

Assistant:

void QIBusEngineDesc::serializeTo(QDBusArgument &argument) const
{
    argument.beginStructure();

    QIBusSerializable::serializeTo(argument);

    argument << engine_name;
    argument << longname;
    argument << description;
    argument << language;
    argument << license;
    argument << author;
    argument << icon;
    argument << layout;
    argument << rank;
    argument << hotkeys;
    argument << symbol;
    argument << setup;
    argument << layout_variant;
    argument << layout_option;
    argument << version;
    argument << textdomain;
    argument << iconpropkey;

    argument.endStructure();
}